

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
make_input_array(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int N)

{
  pointer pfVar1;
  uint uVar2;
  size_t __i;
  long lVar3;
  ulong uVar4;
  float fVar5;
  mt19937 gen;
  random_device rd;
  allocator_type local_2731;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  uVar2 = std::random_device::_M_getval();
  local_2730._M_x[0] = (unsigned_long)uVar2;
  lVar3 = 1;
  uVar4 = local_2730._M_x[0];
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3);
    local_2730._M_x[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_2730._M_p = 0x270;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,(long)N,&local_2731);
  if ((__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      fVar5 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_2730);
      pfVar1 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar1[uVar4] = fVar5 + fVar5 + -1.0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> make_input_array(int N) {
  std::random_device rd;
  std::mt19937 gen(rd());
  std::uniform_real_distribution<float> dis(-1.0f, 1.0f);

  std::vector<float> vf(N);
  for (size_t i = 0; i < vf.size(); ++i) {
    vf[i] = dis(gen);
  }

  return vf;
}